

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void __thiscall kratos::VarSlice::VarSlice(VarSlice *this,Var *parent,uint32_t high,uint32_t low)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  pointer puVar1;
  pointer puVar2;
  undefined1 uVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  VarException *this_00;
  long *plVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar11;
  format_args args;
  string_view format_str;
  initializer_list<const_kratos::IRNode_*> __l;
  Var *local_b0;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_a8;
  pointer local_90;
  pointer ppIStack_88;
  allocator_type local_69;
  string local_68;
  ulong local_40;
  uint32_t local_34;
  
  iVar4 = (*(parent->super_IRNode)._vptr_IRNode[0xd])(parent);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  aVar11.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)0x0;
  Var::Var(&this->super_Var,(Generator *)CONCAT44(extraout_var,iVar4),&local_68,parent->var_width_,1
           ,false,Slice);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  (this->super_Var).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_004c93f0;
  this->parent_var = parent;
  this->low = low;
  this->high = high;
  this->var_high_ = 0;
  this->var_low_ = 0;
  (this->op_).first = high;
  (this->op_).second = low;
  local_40 = 0;
  this->struct_ = (PackedStruct *)0x0;
  uVar5 = num_size_decrease(parent);
  local_34 = low;
  if (low == 0 && high == 0) {
    if (parent->type_ == Slice) {
      uVar6 = num_size_decrease((Var *)parent[1].super_IRNode._vptr_IRNode);
      local_40 = CONCAT44(local_40._4_4_,CONCAT31((int3)(uVar6 >> 8),uVar5 == uVar6));
    }
    else {
      local_40 = local_40 & 0xffffffff00000000;
    }
    iVar4 = (*(parent->super_IRNode)._vptr_IRNode[0x29])(parent);
    if (((ulong)(*(long *)(CONCAT44(extraout_var_00,iVar4) + 0xa8) -
                *(long *)(CONCAT44(extraout_var_00,iVar4) + 0xa0)) < 5) ||
       (iVar4 = (*(parent->super_IRNode)._vptr_IRNode[0x29])(parent),
       (char)local_40 != '\0' ||
       *(int *)(*(long *)(CONCAT44(extraout_var_01,iVar4) + 0xa8) + -4) != 1)) {
      local_40 = 0;
    }
    else {
      iVar4 = (*(parent->super_IRNode)._vptr_IRNode[0x29])(parent);
      lVar8 = CONCAT44(extraout_var_02,iVar4);
      local_40 = CONCAT71((int7)((ulong)lVar8 >> 8),
                          (*(long *)(lVar8 + 0xa8) - *(long *)(lVar8 + 0xa0) >> 2) - 1U ==
                          (ulong)uVar5);
    }
  }
  uVar5 = local_34;
  __first._M_current =
       (parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((long)__last._M_current - (long)__first._M_current == 4) {
    if (*__first._M_current == 1) {
      if (parent->explicit_array_ == true) {
        if (low != 0 || high != 0) {
          this_00 = (VarException *)__cxa_allocate_exception(0x10);
          (*(parent->super_IRNode)._vptr_IRNode[0x1f])(&local_90,parent);
          local_a8.
          super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
          _M_impl.super__Vector_impl_data._M_start = local_90;
          local_a8.
          super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppIStack_88;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = aVar11.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_a8;
          format_str.size_ = 0xd;
          format_str.data_ = (char *)0x50;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_68,
                     (detail *)
                     "Parent {0} is a scalar but used marked as an explicit array, only [0, 0] allowed"
                     ,format_str,args);
          __l._M_len = 1;
          __l._M_array = (iterator)&local_b0;
          local_b0 = parent;
          std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                    (&local_a8,__l,&local_69);
          VarException::VarException(this_00,&local_68,&local_a8);
          __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        if ((char)local_40 == '\0') {
          (this->super_Var).var_width_ = (high - local_34) + 1;
          iVar4 = (*(parent->super_IRNode)._vptr_IRNode[0x18])(parent);
          uVar3 = (undefined1)iVar4;
          goto LAB_003421e8;
        }
        if ((char)local_40 != '\x01') goto LAB_0034210d;
        (this->super_Var).var_width_ = parent->var_width_;
        (this->super_Var).is_packed_ = true;
      }
    }
    else {
LAB_0034210d:
      if (high != local_34) goto LAB_0034214b;
      local_68._M_dataplus._M_p._0_4_ = 1;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&(this->super_Var).size_,
                 &local_68);
      (this->super_Var).is_packed_ = true;
LAB_00342138:
      (this->super_Var).var_width_ = parent->var_width_;
    }
  }
  else {
    if (high == local_34) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )(__first._M_current + 1),__last,(allocator_type *)&local_90);
      puVar2 = (this->super_Var).size_.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar1 = (this->super_Var).size_.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (this->super_Var).size_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_68._M_dataplus._M_p;
      (this->super_Var).size_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_68._M_string_length;
      (this->super_Var).size_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_68.field_2._M_allocated_capacity;
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      local_68.field_2._M_allocated_capacity = 0;
      if ((puVar2 != (pointer)0x0) &&
         (operator_delete(puVar2,(long)puVar1 - (long)puVar2),
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_68._M_dataplus._M_p !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0)) {
        operator_delete(local_68._M_dataplus._M_p,
                        local_68.field_2._M_allocated_capacity - (long)local_68._M_dataplus._M_p);
      }
      iVar4 = (*(parent->super_IRNode)._vptr_IRNode[0x18])(parent);
      (this->super_Var).is_packed_ = SUB41(iVar4,0);
      goto LAB_00342138;
    }
LAB_0034214b:
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,__first,__last,
               (allocator_type *)&local_90);
    puVar2 = (this->super_Var).size_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->super_Var).size_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->super_Var).size_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_68._M_dataplus._M_p;
    (this->super_Var).size_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_68._M_string_length;
    (this->super_Var).size_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_68.field_2._M_allocated_capacity;
    local_68._M_dataplus._M_p = (pointer)0x0;
    local_68._M_string_length = 0;
    local_68.field_2._M_allocated_capacity = 0;
    if ((puVar2 != (pointer)0x0) &&
       (operator_delete(puVar2,(long)puVar1 - (long)puVar2),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_68._M_dataplus._M_p !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0)) {
      operator_delete(local_68._M_dataplus._M_p,
                      local_68.field_2._M_allocated_capacity - (long)local_68._M_dataplus._M_p);
    }
    (this->super_Var).size_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish[-1] = (high - uVar5) + 1;
    (this->super_Var).var_width_ = parent->var_width_;
    iVar4 = (*(parent->super_IRNode)._vptr_IRNode[0x18])(parent);
    uVar3 = (undefined1)iVar4;
LAB_003421e8:
    (this->super_Var).is_packed_ = (bool)uVar3;
  }
  if (parent->type_ == Slice) {
    plVar7 = (long *)__dynamic_cast(parent,&Var::typeinfo,&typeinfo,0);
    puVar2 = (parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    lVar8 = (long)(parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
    if (lVar8 == 4) {
      if (*puVar2 == 1 && (byte)local_40 == 0) {
        iVar4 = (**(code **)(*plVar7 + 0x130))(plVar7);
        this->var_low_ = iVar4 + local_34;
        iVar4 = (**(code **)(*plVar7 + 0x130))(plVar7);
        high = high + iVar4;
        goto LAB_003423c4;
      }
      if (((byte)local_40 & *puVar2 == 1) != 0) {
        uVar5 = (**(code **)(*plVar7 + 0x130))(plVar7);
        this->var_low_ = uVar5;
        high = (**(code **)(*plVar7 + 0x128))(plVar7);
        goto LAB_003423c4;
      }
      uVar5 = parent->var_width_;
    }
    else {
      uVar9 = lVar8 >> 2;
      uVar5 = parent->var_width_;
      if (1 < uVar9) {
        uVar10 = 1;
        do {
          uVar5 = uVar5 * puVar2[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
    }
    iVar4 = (**(code **)(*plVar7 + 0x130))(plVar7);
    this->var_low_ = iVar4 + local_34 * uVar5;
    iVar4 = (**(code **)(*plVar7 + 0x130))(plVar7);
    high = (uVar5 * (high + 1) + iVar4) - 1;
    goto LAB_003423c4;
  }
  puVar2 = (parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = (long)(parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
  if (lVar8 == 4) {
    if (*puVar2 != 1) {
      uVar5 = parent->var_width_;
      goto LAB_00342350;
    }
    if (parent->explicit_array_ != true) {
      this->var_low_ = local_34;
      goto LAB_003423c4;
    }
    this->var_low_ = 0;
    uVar5 = (this->super_Var).var_width_;
  }
  else {
    uVar9 = lVar8 >> 2;
    uVar5 = parent->var_width_;
    if (1 < uVar9) {
      uVar10 = 1;
      do {
        uVar5 = uVar5 * puVar2[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
LAB_00342350:
    this->var_low_ = local_34 * uVar5;
    uVar5 = (high + 1) * uVar5;
  }
  high = uVar5 - 1;
LAB_003423c4:
  this->var_high_ = high;
  return;
}

Assistant:

VarSlice::VarSlice(Var *parent, uint32_t high, uint32_t low)
    // variable slice is always unsigned based on the spec
    : Var(parent->generator(), "", parent->var_width(), 1, false, VarType::Slice),
      parent_var(parent),
      low(low),
      high(high),
      op_({high, low}) {
    // compute the width
    // notice that if the user has explicit set it to be an array
    // we need to honer their wish
    // we also need to honer the way the dimension the array is set
    auto diff = num_size_decrease(parent);
    auto diff_parent = true;
    if (low == 0 && high == 0 && parent->type() == VarType::Slice) {
        auto p_d = num_size_decrease(reinterpret_cast<VarSlice *>(parent)->parent_var);
        diff_parent = diff != p_d;
    }
    bool dropped_dim_size1 = low == 0 && high == 0 &&
                             parent->get_var_root_parent()->size().size() > 1 &&
                             parent->get_var_root_parent()->size().back() == 1 && diff_parent &&
                             diff == parent->get_var_root_parent()->size().size() - 1;
    if (parent->size().size() == 1 && parent->size().front() == 1 && parent->explicit_array()) {
        if (high != 0 || low != 0) {
            throw VarException(::format("Parent {0} is a scalar but used marked as an explicit "
                                        "array, only [0, 0] allowed",
                                        parent->to_string()),
                               {parent});
        }
    } else if (parent->size().size() == 1 && parent->size().front() == 1 && !dropped_dim_size1) {
        // even it is true, we still need to make sure cases such as
        // [3:0][0:0] declaration (from size = (4, 1)), can be sliced twice before hitting
        // the wire, which means we need to count the number of size decreases
        // this is the actual slice
        var_width_ = high - low + 1;
        is_packed_ = parent->is_packed();
    } else if (parent->size().size() == 1 && parent->size().front() == 1 && dropped_dim_size1) {
        // need to keep the var width calculation correct
        var_width_ = parent->var_width();
        is_packed_ = true;
    } else {
        if (high == low) {
            if (parent->size().size() == 1) {
                size_ = {1};
                is_packed_ = true;
            } else {
                size_ = std::vector<uint32_t>(parent->size().begin() + 1, parent->size().end());
                is_packed_ = parent->is_packed();
            }
            var_width_ = parent->var_width();
        } else {
            // readjust the top slice
            size_ = std::vector<uint32_t>(parent->size().begin(), parent->size().end());
            size_.back() = high - low + 1;
            var_width_ = parent->var_width();
            is_packed_ = parent->is_packed();
        }
    }
    // compute the var high and var_low
    if (parent->type() != VarType::Slice) {
        // use width to compute
        // honer user's wish
        if (parent->size().size() == 1 && parent->size().front() == 1 && parent->explicit_array()) {
            var_low_ = 0;
            var_high_ = var_width_ - 1;
        } else if (parent->size().size() == 1 && parent->size().front() == 1) {
            var_low_ = low;
            var_high_ = high;
        } else {
            uint32_t base_width = parent->var_width();
            for (uint64_t i = 1; i < parent->size().size(); i++) base_width *= parent->size()[i];
            var_low_ = low * base_width;
            var_high_ = (high + 1) * base_width - 1;
        }
    } else {
        // it's a slice
        auto *slice = dynamic_cast<VarSlice *>(parent);
        if (parent->size().size() == 1 && parent->size().front() == 1 && !dropped_dim_size1) {
            var_low_ = low + slice->var_low();
            var_high_ = (high + 1) + slice->var_low() - 1;
        } else if (parent->size().size() == 1 && parent->size().front() == 1 && dropped_dim_size1) {
            var_low_ = slice->var_low();
            var_high_ = slice->var_high();
        } else {
            uint32_t base_width = parent->var_width();
            for (uint64_t i = 1; i < parent->size().size(); i++) base_width *= parent->size()[i];
            var_low_ = slice->var_low() + low * base_width;
            var_high_ = slice->var_low() + (high + 1) * base_width - 1;
        }
    }
}